

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlSimulateOne(Fra_Sml_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  abctime aVar3;
  Aig_Obj_t *pAVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *pIn;
  abctime aVar6;
  int iFrame;
  int iVar7;
  int i;
  
  aVar3 = Abc_Clock();
  for (iFrame = 0; iFrame < p->nFrames; iFrame = iFrame + 1) {
    iVar7 = 0;
    while( true ) {
      pAVar5 = p->pAig;
      if (pAVar5->vObjs->nSize <= iVar7) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vObjs,iVar7);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        Fra_SmlNodeSimulate(p,pAVar4,iFrame);
      }
      iVar7 = iVar7 + 1;
    }
    for (iVar7 = 0; i = pAVar5->nObjs[3] - pAVar5->nRegs, iVar7 < i; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vCos,iVar7);
      Fra_SmlNodeCopyFanin(p,pAVar4,iFrame);
      pAVar5 = p->pAig;
    }
    if (iFrame == p->nFrames + -1) break;
    for (; i < pAVar5->vCos->nSize; i = i + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vCos,i);
      Fra_SmlNodeCopyFanin(p,pAVar4,iFrame);
      pAVar5 = p->pAig;
    }
    for (iVar7 = 0; iVar7 < pAVar5->nRegs; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vCos,(pAVar5->nObjs[3] - pAVar5->nRegs) + iVar7);
      pAVar5 = p->pAig;
      pIn = (Aig_Obj_t *)Vec_PtrEntry(pAVar5->vCis,(pAVar5->nObjs[2] - pAVar5->nRegs) + iVar7);
      Fra_SmlNodeTransferNext(p,pAVar4,pIn,iFrame);
      pAVar5 = p->pAig;
    }
  }
  aVar6 = Abc_Clock();
  uVar1 = p->nSimRounds;
  uVar2 = p->timeSim;
  p->nSimRounds = uVar1 + 1;
  p->timeSim = ((int)aVar6 - (int)aVar3) + uVar2;
  return;
}

Assistant:

void Fra_SmlSimulateOne( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int f, i;
    abctime clk;
clk = Abc_Clock();
    for ( f = 0; f < p->nFrames; f++ )
    {
        // simulate the nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            Fra_SmlNodeSimulate( p, pObj, f );
        // copy simulation info into outputs
        Aig_ManForEachPoSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // quit if this is the last timeframe
        if ( f == p->nFrames - 1 )
            break;
        // copy simulation info into outputs
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            Fra_SmlNodeCopyFanin( p, pObj, f );
        // copy simulation info into the inputs
        Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )
            Fra_SmlNodeTransferNext( p, pObjLi, pObjLo, f );
    }
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}